

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O2

Result wabt::ResolveNamesModule(Module *module,Errors *errors)

{
  Result RVar1;
  NameResolver resolver;
  NameResolver NStack_a8;
  
  anon_unknown_16::NameResolver::NameResolver(&NStack_a8,(Script *)0x0,errors);
  RVar1 = anon_unknown_16::NameResolver::VisitModule(&NStack_a8,module);
  anon_unknown_16::NameResolver::~NameResolver(&NStack_a8);
  return (Result)RVar1.enum_;
}

Assistant:

Result ResolveNamesModule(Module* module, Errors* errors) {
  NameResolver resolver(nullptr, errors);
  return resolver.VisitModule(module);
}